

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall
QColumnView::setSelectionModel(QColumnView *this,QItemSelectionModel *newSelectionModel)

{
  QColumnViewPrivate *pQVar1;
  QAbstractItemView *this_00;
  qsizetype qVar2;
  QItemSelectionModel *pQVar3;
  const_reference ppQVar4;
  undefined8 in_RSI;
  int i;
  QColumnViewPrivate *d;
  QItemSelectionModel *in_stack_00000050;
  QAbstractItemView *in_stack_00000058;
  QItemSelectionModel *in_stack_ffffffffffffffc8;
  int local_1c;
  
  pQVar1 = d_func((QColumnView *)0x864831);
  local_1c = 0;
  do {
    this_00 = (QAbstractItemView *)(long)local_1c;
    qVar2 = QList<QAbstractItemView_*>::size(&pQVar1->columns);
    if (qVar2 <= (long)this_00) {
LAB_008648d9:
      QAbstractItemView::setSelectionModel(in_stack_00000058,in_stack_00000050);
      return;
    }
    QList<QAbstractItemView_*>::at
              ((QList<QAbstractItemView_*> *)this_00,(qsizetype)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffc8 = QAbstractItemView::selectionModel(this_00);
    pQVar3 = QAbstractItemView::selectionModel(this_00);
    if (in_stack_ffffffffffffffc8 == pQVar3) {
      ppQVar4 = QList<QAbstractItemView_*>::at
                          ((QList<QAbstractItemView_*> *)this_00,
                           (qsizetype)in_stack_ffffffffffffffc8);
      (**(code **)(*(long *)&((*ppQVar4)->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                  0x1d0))(*ppQVar4,in_RSI);
      goto LAB_008648d9;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void QColumnView::setSelectionModel(QItemSelectionModel *newSelectionModel)
{
    Q_D(const QColumnView);
    for (int i = 0; i < d->columns.size(); ++i) {
        if (d->columns.at(i)->selectionModel() == selectionModel()) {
            d->columns.at(i)->setSelectionModel(newSelectionModel);
            break;
        }
    }
    QAbstractItemView::setSelectionModel(newSelectionModel);
}